

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void iq2xs_init_impl(ggml_type type)

{
  ushort uVar1;
  undefined4 uVar2;
  byte bVar3;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  byte bVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined8 uVar24;
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  unkuint9 Var27;
  undefined1 auVar28 [11];
  undefined6 uVar29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  unkbyte10 Var38;
  int iVar39;
  int k;
  ulong uVar40;
  ulong uVar41;
  int *__s;
  int *__base;
  ulong uVar42;
  uint64_t *puVar43;
  bool bVar44;
  int j;
  int iVar45;
  ulong uVar46;
  uint uVar47;
  long lVar48;
  ulong __nmemb;
  int iVar49;
  int i_1;
  int iVar50;
  uint16_t *puVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  undefined1 uVar63;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  uint uVar76;
  uint uVar77;
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  uint uVar78;
  undefined1 auVar73 [16];
  ushort uVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  undefined1 auVar88 [16];
  int8_t pos [8];
  ulong local_40;
  uint64_t *local_38;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined2 uVar64;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  
  switch(type) {
  case GGML_TYPE_IQ2_XXS:
    uVar47 = 0x100;
    uVar40 = 0;
    break;
  case GGML_TYPE_IQ2_XS:
    uVar47 = 0x200;
    uVar40 = 1;
    break;
  case GGML_TYPE_IQ3_XXS:
  case GGML_TYPE_IQ4_NL:
  case GGML_TYPE_IQ3_S:
switchD_0013363c_caseD_12:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-quants.c"
               ,0x9f1,"GGML_ASSERT(%s) failed",
               "type == GGML_TYPE_IQ2_XXS || type == GGML_TYPE_IQ2_XS || type == GGML_TYPE_IQ1_S || type == GGML_TYPE_IQ1_M || type == GGML_TYPE_IQ2_S"
              );
  default:
    if (type != GGML_TYPE_IQ1_M) goto switchD_0013363c_caseD_12;
  case GGML_TYPE_IQ1_S:
  case GGML_TYPE_IQ2_S:
    bVar44 = type == GGML_TYPE_IQ1_M || type == GGML_TYPE_IQ1_S;
    uVar47 = (uint)bVar44 * 0x400 + 0x400;
    uVar40 = (ulong)bVar44 ^ 3;
  }
  if (iq2_data[uVar40].grid == (uint64_t *)0x0) {
    __nmemb = (ulong)uVar47;
    iVar49 = 3;
    if ((type != GGML_TYPE_IQ1_S) && (type != GGML_TYPE_IQ1_M)) {
      iVar49 = (type != GGML_TYPE_IQ2_S) + 1;
    }
    if (type == GGML_TYPE_IQ2_XXS) {
      puVar51 = iq2xs_init_impl::kgrid_2bit_256;
    }
    else if (type == GGML_TYPE_IQ2_XS) {
      puVar51 = iq2xs_init_impl::kgrid_2bit_512;
    }
    else {
      puVar51 = iq2xs_init_impl::kgrid_2bit_1024;
      if (type == GGML_TYPE_IQ1_S || type == GGML_TYPE_IQ1_M) {
        puVar51 = iq2xs_init_impl::kgrid_1bit_2048;
      }
    }
    local_38 = (uint64_t *)malloc((ulong)(uVar47 * 8));
    uVar41 = 0;
    do {
      uVar1 = puVar51[uVar41];
      uVar13 = uVar1 >> 0xe;
      uVar14 = uVar1 >> 0xc;
      uVar15 = uVar1 >> 10;
      uVar16 = uVar1 >> 8;
      uVar79 = uVar1 & 0xff;
      uVar10 = uVar1 >> 2 & 0xff;
      uVar11 = uVar1 >> 4 & 0xff;
      uVar12 = uVar1 >> 6 & 0xff;
      bVar3 = (uVar79 != 0) * (uVar79 < 0x100) * (char)uVar1 - (0xff < uVar79);
      bVar4 = (uVar10 != 0) * (uVar10 < 0x100) * (char)(uVar1 >> 2) - (0xff < uVar10);
      bVar5 = (uVar11 != 0) * (uVar11 < 0x100) * (char)(uVar1 >> 4) - (0xff < uVar11);
      bVar6 = (uVar12 != 0) * (uVar12 < 0x100) * (char)(uVar1 >> 6) - (0xff < uVar12);
      bVar17 = (byte)(uVar1 >> 8);
      bVar7 = (uVar16 != 0) * (uVar16 < 0x100) * bVar17 - (0xff < uVar16);
      bVar8 = (uVar15 != 0) * (uVar15 < 0x100) * (bVar17 >> 2) - (0xff < uVar15);
      bVar9 = (uVar14 != 0) * (uVar14 < 0x100) * (bVar17 >> 4) - (0xff < uVar14);
      bVar17 = (uVar13 != 0) * (uVar13 < 0x100) * (bVar17 >> 6) - (0xff < uVar13);
      local_38[uVar41] =
           CONCAT17(((bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17)) * '\x02',
                    CONCAT16(((bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9)) * '\x02',
                             CONCAT15(((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8)) *
                                      '\x02',CONCAT14(((bVar7 != 0) * (bVar7 < 0x100) * bVar7 -
                                                      (0xff < bVar7)) * '\x02',
                                                      CONCAT13(((bVar6 != 0) * (bVar6 < 0x100) *
                                                                bVar6 - (0xff < bVar6)) * '\x02',
                                                               CONCAT12(((bVar5 != 0) *
                                                                         (bVar5 < 0x100) * bVar5 -
                                                                        (0xff < bVar5)) * '\x02',
                                                                        CONCAT11(((bVar4 != 0) *
                                                                                  (bVar4 < 0x100) *
                                                                                  bVar4 - (0xff < 
                                                  bVar4)) * '\x02',
                                                  ((bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                                  (0xff < bVar3)) * '\x02'))))))) &
           (ulong)DAT_0014e920 | (ulong)DAT_0014e930;
      uVar41 = uVar41 + 1;
    } while (__nmemb != uVar41);
    iq2_data[uVar40].grid = local_38;
    __s = (int *)malloc(0x2aab0);
    iq2_data[uVar40].map = __s;
    memset(__s,0xff,0x2aab0);
    uVar41 = 0;
    do {
      uVar46 = local_38[uVar41];
      auVar18._8_6_ = 0;
      auVar18._0_8_ = uVar46;
      auVar18[0xe] = (char)(uVar46 >> 0x38);
      auVar19._8_4_ = 0;
      auVar19._0_8_ = uVar46;
      auVar19[0xc] = (char)(uVar46 >> 0x30);
      auVar19._13_2_ = auVar18._13_2_;
      auVar20._8_4_ = 0;
      auVar20._0_8_ = uVar46;
      auVar20._12_3_ = auVar19._12_3_;
      auVar21._8_2_ = 0;
      auVar21._0_8_ = uVar46;
      auVar21[10] = (char)(uVar46 >> 0x28);
      auVar21._11_4_ = auVar20._11_4_;
      auVar22._8_2_ = 0;
      auVar22._0_8_ = uVar46;
      auVar22._10_5_ = auVar21._10_5_;
      auVar23[8] = (char)(uVar46 >> 0x20);
      auVar23._0_8_ = uVar46;
      auVar23._9_6_ = auVar22._9_6_;
      auVar26._7_8_ = 0;
      auVar26._0_7_ = auVar23._8_7_;
      Var27 = CONCAT81(SUB158(auVar26 << 0x40,7),(char)(uVar46 >> 0x18));
      auVar36._9_6_ = 0;
      auVar36._0_9_ = Var27;
      auVar28._1_10_ = SUB1510(auVar36 << 0x30,5);
      auVar28[0] = (char)(uVar46 >> 0x10);
      auVar37._11_4_ = 0;
      auVar37._0_11_ = auVar28;
      auVar25[2] = (char)(uVar46 >> 8);
      auVar25._0_2_ = (ushort)uVar46;
      auVar25._3_12_ = SUB1512(auVar37 << 0x20,3);
      sVar80 = ((ushort)uVar46 & 0xff) - 1;
      sVar81 = auVar25._2_2_ + -1;
      sVar82 = auVar28._0_2_ + -1;
      sVar83 = (short)Var27 + -1;
      sVar84 = auVar23._8_2_ + -1;
      sVar85 = auVar21._10_2_ + -1;
      sVar86 = auVar19._12_2_ + -1;
      sVar87 = (auVar18._13_2_ >> 8) - 1;
      auVar88._0_2_ = sVar80 - (sVar80 >> 0xf);
      auVar88._2_2_ = sVar81 - (sVar81 >> 0xf);
      auVar88._4_2_ = sVar82 - (sVar82 >> 0xf);
      auVar88._6_2_ = sVar83 - (sVar83 >> 0xf);
      auVar88._8_2_ = sVar84 - (sVar84 >> 0xf);
      auVar88._10_2_ = sVar85 - (sVar85 >> 0xf);
      auVar88._12_2_ = sVar86 - (sVar86 >> 0xf);
      auVar88._14_2_ = sVar87 - (sVar87 >> 0xf);
      auVar88 = psraw(auVar88,1);
      __s[(ushort)(auVar88._14_2_ * 0x4000 | auVar88._6_2_ * 0x40 |
                   auVar88._10_2_ * 0x400 | auVar88._2_2_ * 4 |
                  auVar88._12_2_ * 0x1000 | auVar88._4_2_ * 0x10 |
                  auVar88._8_2_ * 0x100 | auVar88._0_2_)] = (int)uVar41;
      uVar41 = uVar41 + 1;
    } while (__nmemb != uVar41);
    __base = (int *)malloc((ulong)(uVar47 * 8));
    uVar41 = 0;
    iVar50 = 0;
    iVar45 = 0;
    do {
      if (__s[uVar41] < 0) {
        uVar66 = (uint)uVar41;
        uVar67 = uVar66 >> 6;
        uVar76 = uVar66 >> 4;
        uVar65 = uVar66 >> 2;
        uVar68 = uVar66 >> 0xe;
        uVar77 = uVar66 >> 0xc;
        uVar66 = uVar66 >> 10;
        uVar13 = (ushort)(uVar41 >> 8) & 0xff;
        uVar14 = (ushort)uVar66 & 0xff;
        uVar15 = (ushort)uVar77 & 0xff;
        uVar16 = (ushort)uVar68 & 0xff;
        uVar1 = (ushort)uVar41 & 0xff;
        uVar10 = (ushort)uVar65 & 0xff;
        uVar11 = (ushort)uVar76 & 0xff;
        uVar12 = (ushort)uVar67 & 0xff;
        bVar3 = ((uVar41 & 0xff) != 0) * (uVar1 < 0x100) * (char)uVar41 - (0xff < uVar1);
        bVar4 = ((uVar65 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar65 - (0xff < uVar10);
        bVar5 = ((uVar76 & 0xff) != 0) * (uVar11 < 0x100) * (char)uVar76 - (0xff < uVar11);
        bVar6 = ((uVar67 & 0xff) != 0) * (uVar12 < 0x100) * (char)uVar67 - (0xff < uVar12);
        bVar7 = ((uVar41 & 0xff00) != 0) * (uVar13 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar13);
        bVar8 = ((uVar66 & 0xff) != 0) * (uVar14 < 0x100) * (char)uVar66 - (0xff < uVar14);
        bVar9 = ((uVar77 & 0xff) != 0) * (uVar15 < 0x100) * (char)uVar77 - (0xff < uVar15);
        bVar17 = ((uVar68 & 0xff) != 0) * (uVar16 < 0x100) * (char)uVar68 - (0xff < uVar16);
        local_40 = CONCAT17(((bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17)) * '\x02',
                            CONCAT16(((bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9)) *
                                     '\x02',CONCAT15(((bVar8 != 0) * (bVar8 < 0x100) * bVar8 -
                                                     (0xff < bVar8)) * '\x02',
                                                     CONCAT14(((bVar7 != 0) * (bVar7 < 0x100) *
                                                               bVar7 - (0xff < bVar7)) * '\x02',
                                                              CONCAT13(((bVar6 != 0) *
                                                                        (bVar6 < 0x100) * bVar6 -
                                                                       (0xff < bVar6)) * '\x02',
                                                                       CONCAT12(((bVar5 != 0) *
                                                                                 (bVar5 < 0x100) *
                                                                                 bVar5 - (0xff < 
                                                  bVar5)) * '\x02',
                                                  CONCAT11(((bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                                           (0xff < bVar4)) * '\x02',
                                                           ((bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                                           (0xff < bVar3)) * '\x02'))))))) &
                   0x606060606060606 | (ulong)DAT_0014e930;
        uVar46 = 0;
        puVar43 = local_38;
        do {
          iVar52 = 0;
          iVar53 = 0;
          iVar54 = 0;
          iVar55 = 0;
          lVar48 = 0;
          do {
            uVar2 = *(undefined4 *)((long)puVar43 + lVar48);
            uVar63 = (undefined1)((uint)uVar2 >> 0x18);
            uVar64 = CONCAT11(uVar63,uVar63);
            uVar63 = (undefined1)((uint)uVar2 >> 0x10);
            uVar24 = CONCAT35(CONCAT21(uVar64,uVar63),CONCAT14(uVar63,uVar2));
            uVar63 = (undefined1)((uint)uVar2 >> 8);
            uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar63),uVar63);
            sVar80 = CONCAT11((char)uVar2,(char)uVar2);
            uVar42 = CONCAT62(uVar29,sVar80);
            auVar72._8_4_ = 0;
            auVar72._0_8_ = uVar42;
            auVar72._12_2_ = uVar64;
            auVar72._14_2_ = uVar64;
            uVar64 = (undefined2)((ulong)uVar24 >> 0x20);
            auVar57._12_4_ = auVar72._12_4_;
            auVar57._8_2_ = 0;
            auVar57._0_8_ = uVar42;
            auVar57._10_2_ = uVar64;
            auVar56._10_6_ = auVar57._10_6_;
            auVar56._8_2_ = uVar64;
            auVar56._0_8_ = uVar42;
            uVar64 = (undefined2)uVar29;
            auVar30._4_8_ = auVar56._8_8_;
            auVar30._2_2_ = uVar64;
            auVar30._0_2_ = uVar64;
            uVar2 = *(undefined4 *)((long)&local_40 + lVar48);
            uVar63 = (undefined1)((uint)uVar2 >> 0x18);
            uVar64 = CONCAT11(uVar63,uVar63);
            uVar63 = (undefined1)((uint)uVar2 >> 0x10);
            uVar24 = CONCAT35(CONCAT21(uVar64,uVar63),CONCAT14(uVar63,uVar2));
            uVar63 = (undefined1)((uint)uVar2 >> 8);
            uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar63),uVar63);
            sVar81 = CONCAT11((char)uVar2,(char)uVar2);
            uVar42 = CONCAT62(uVar29,sVar81);
            auVar71._8_4_ = 0;
            auVar71._0_8_ = uVar42;
            auVar71._12_2_ = uVar64;
            auVar71._14_2_ = uVar64;
            uVar64 = (undefined2)((ulong)uVar24 >> 0x20);
            auVar70._12_4_ = auVar71._12_4_;
            auVar70._8_2_ = 0;
            auVar70._0_8_ = uVar42;
            auVar70._10_2_ = uVar64;
            auVar69._10_6_ = auVar70._10_6_;
            auVar69._8_2_ = uVar64;
            auVar69._0_8_ = uVar42;
            uVar64 = (undefined2)uVar29;
            auVar31._4_8_ = auVar69._8_8_;
            auVar31._2_2_ = uVar64;
            auVar31._0_2_ = uVar64;
            auVar58._0_4_ = ((int)sVar80 >> 8) - ((int)sVar81 >> 8);
            auVar58._4_4_ = (auVar30._0_4_ >> 0x18) - (auVar31._0_4_ >> 0x18);
            auVar58._8_4_ = (auVar56._8_4_ >> 0x18) - (auVar69._8_4_ >> 0x18);
            auVar58._12_4_ = (auVar57._12_4_ >> 0x18) - (auVar70._12_4_ >> 0x18);
            auVar88 = packssdw(auVar58,auVar58);
            auVar72 = pmulhw(auVar88,auVar88);
            sVar80 = auVar88._6_2_ * auVar88._6_2_;
            iVar39 = CONCAT22(auVar72._6_2_,sVar80);
            Var38 = CONCAT64(CONCAT42(iVar39,auVar72._4_2_),
                             CONCAT22(auVar88._4_2_ * auVar88._4_2_,sVar80));
            auVar32._4_8_ = (long)((unkuint10)Var38 >> 0x10);
            auVar32._2_2_ = auVar72._2_2_;
            auVar32._0_2_ = auVar88._2_2_ * auVar88._2_2_;
            iVar52 = iVar52 + CONCAT22(auVar72._0_2_,auVar88._0_2_ * auVar88._0_2_);
            iVar53 = iVar53 + auVar32._0_4_;
            iVar54 = iVar54 + (int)((unkuint10)Var38 >> 0x10);
            iVar55 = iVar55 + iVar39;
            lVar48 = lVar48 + 4;
          } while (lVar48 != 8);
          __base[uVar46 * 2] = iVar55 + iVar53 + iVar54 + iVar52;
          __base[uVar46 * 2 + 1] = (int)uVar46;
          uVar46 = uVar46 + 1;
          puVar43 = puVar43 + 1;
        } while (uVar46 != __nmemb);
        iVar50 = iVar50 + 1;
        qsort(__base,__nmemb,8,iq2_compare_func);
        iVar52 = *__base;
        iVar53 = 1;
        uVar46 = 0;
        do {
          if (iVar52 < __base[uVar46 * 2]) {
            uVar42 = uVar46;
            if (iVar53 == iVar49) break;
            iVar53 = iVar53 + 1;
            iVar52 = __base[uVar46 * 2];
          }
          uVar46 = uVar46 + 1;
          uVar42 = __nmemb;
        } while (__nmemb != uVar46);
        iVar45 = iVar45 + (int)uVar42;
      }
      uVar41 = uVar41 + 1;
    } while (uVar41 != 0xaaac);
    puVar51 = (uint16_t *)malloc((long)(iVar50 + iVar45) * 2);
    iq2_data[uVar40].neighbours = puVar51;
    uVar40 = 0;
    uVar66 = 0;
    do {
      if (__s[uVar40] < 0) {
        uVar65 = (uint)uVar40;
        uVar68 = uVar65 >> 6;
        uVar77 = uVar65 >> 4;
        uVar67 = uVar65 >> 2;
        uVar76 = uVar65 >> 0xe;
        uVar78 = uVar65 >> 0xc;
        uVar65 = uVar65 >> 10;
        uVar13 = (ushort)(uVar40 >> 8) & 0xff;
        uVar14 = (ushort)uVar65 & 0xff;
        uVar15 = (ushort)uVar78 & 0xff;
        uVar16 = (ushort)uVar76 & 0xff;
        uVar1 = (ushort)uVar40 & 0xff;
        uVar10 = (ushort)uVar67 & 0xff;
        uVar11 = (ushort)uVar77 & 0xff;
        uVar12 = (ushort)uVar68 & 0xff;
        bVar4 = ((uVar40 & 0xff) != 0) * (uVar1 < 0x100) * (char)uVar40 - (0xff < uVar1);
        bVar5 = ((uVar67 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar67 - (0xff < uVar10);
        bVar6 = ((uVar77 & 0xff) != 0) * (uVar11 < 0x100) * (char)uVar77 - (0xff < uVar11);
        bVar7 = ((uVar68 & 0xff) != 0) * (uVar12 < 0x100) * (char)uVar68 - (0xff < uVar12);
        bVar8 = ((uVar40 & 0xff00) != 0) * (uVar13 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar13);
        bVar9 = ((uVar65 & 0xff) != 0) * (uVar14 < 0x100) * (char)uVar65 - (0xff < uVar14);
        bVar17 = ((uVar78 & 0xff) != 0) * (uVar15 < 0x100) * (char)uVar78 - (0xff < uVar15);
        bVar3 = ((uVar76 & 0xff) != 0) * (uVar16 < 0x100) * (char)uVar76 - (0xff < uVar16);
        local_40 = CONCAT17(((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3)) * '\x02',
                            CONCAT16(((bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17)) *
                                     '\x02',CONCAT15(((bVar9 != 0) * (bVar9 < 0x100) * bVar9 -
                                                     (0xff < bVar9)) * '\x02',
                                                     CONCAT14(((bVar8 != 0) * (bVar8 < 0x100) *
                                                               bVar8 - (0xff < bVar8)) * '\x02',
                                                              CONCAT13(((bVar7 != 0) *
                                                                        (bVar7 < 0x100) * bVar7 -
                                                                       (0xff < bVar7)) * '\x02',
                                                                       CONCAT12(((bVar6 != 0) *
                                                                                 (bVar6 < 0x100) *
                                                                                 bVar6 - (0xff < 
                                                  bVar6)) * '\x02',
                                                  CONCAT11(((bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                                           (0xff < bVar5)) * '\x02',
                                                           ((bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                                           (0xff < bVar4)) * '\x02'))))))) &
                   0x606060606060606 | (ulong)DAT_0014e930;
        uVar41 = 0;
        puVar43 = local_38;
        do {
          iVar45 = 0;
          iVar50 = 0;
          iVar52 = 0;
          iVar53 = 0;
          lVar48 = 0;
          do {
            uVar2 = *(undefined4 *)((long)puVar43 + lVar48);
            uVar63 = (undefined1)((uint)uVar2 >> 0x18);
            uVar64 = CONCAT11(uVar63,uVar63);
            uVar63 = (undefined1)((uint)uVar2 >> 0x10);
            uVar24 = CONCAT35(CONCAT21(uVar64,uVar63),CONCAT14(uVar63,uVar2));
            uVar63 = (undefined1)((uint)uVar2 >> 8);
            uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar63),uVar63);
            sVar80 = CONCAT11((char)uVar2,(char)uVar2);
            uVar46 = CONCAT62(uVar29,sVar80);
            auVar61._8_4_ = 0;
            auVar61._0_8_ = uVar46;
            auVar61._12_2_ = uVar64;
            auVar61._14_2_ = uVar64;
            uVar64 = (undefined2)((ulong)uVar24 >> 0x20);
            auVar60._12_4_ = auVar61._12_4_;
            auVar60._8_2_ = 0;
            auVar60._0_8_ = uVar46;
            auVar60._10_2_ = uVar64;
            auVar59._10_6_ = auVar60._10_6_;
            auVar59._8_2_ = uVar64;
            auVar59._0_8_ = uVar46;
            uVar64 = (undefined2)uVar29;
            auVar33._4_8_ = auVar59._8_8_;
            auVar33._2_2_ = uVar64;
            auVar33._0_2_ = uVar64;
            uVar2 = *(undefined4 *)((long)&local_40 + lVar48);
            uVar63 = (undefined1)((uint)uVar2 >> 0x18);
            uVar64 = CONCAT11(uVar63,uVar63);
            uVar63 = (undefined1)((uint)uVar2 >> 0x10);
            uVar24 = CONCAT35(CONCAT21(uVar64,uVar63),CONCAT14(uVar63,uVar2));
            uVar63 = (undefined1)((uint)uVar2 >> 8);
            uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar63),uVar63);
            sVar81 = CONCAT11((char)uVar2,(char)uVar2);
            uVar46 = CONCAT62(uVar29,sVar81);
            auVar75._8_4_ = 0;
            auVar75._0_8_ = uVar46;
            auVar75._12_2_ = uVar64;
            auVar75._14_2_ = uVar64;
            uVar64 = (undefined2)((ulong)uVar24 >> 0x20);
            auVar74._12_4_ = auVar75._12_4_;
            auVar74._8_2_ = 0;
            auVar74._0_8_ = uVar46;
            auVar74._10_2_ = uVar64;
            auVar73._10_6_ = auVar74._10_6_;
            auVar73._8_2_ = uVar64;
            auVar73._0_8_ = uVar46;
            uVar64 = (undefined2)uVar29;
            auVar34._4_8_ = auVar73._8_8_;
            auVar34._2_2_ = uVar64;
            auVar34._0_2_ = uVar64;
            auVar62._0_4_ = ((int)sVar80 >> 8) - ((int)sVar81 >> 8);
            auVar62._4_4_ = (auVar33._0_4_ >> 0x18) - (auVar34._0_4_ >> 0x18);
            auVar62._8_4_ = (auVar59._8_4_ >> 0x18) - (auVar73._8_4_ >> 0x18);
            auVar62._12_4_ = (auVar60._12_4_ >> 0x18) - (auVar74._12_4_ >> 0x18);
            auVar88 = packssdw(auVar62,auVar62);
            auVar72 = pmulhw(auVar88,auVar88);
            sVar80 = auVar88._6_2_ * auVar88._6_2_;
            iVar54 = CONCAT22(auVar72._6_2_,sVar80);
            Var38 = CONCAT64(CONCAT42(iVar54,auVar72._4_2_),
                             CONCAT22(auVar88._4_2_ * auVar88._4_2_,sVar80));
            auVar35._4_8_ = (long)((unkuint10)Var38 >> 0x10);
            auVar35._2_2_ = auVar72._2_2_;
            auVar35._0_2_ = auVar88._2_2_ * auVar88._2_2_;
            iVar45 = iVar45 + CONCAT22(auVar72._0_2_,auVar88._0_2_ * auVar88._0_2_);
            iVar50 = iVar50 + auVar35._0_4_;
            iVar52 = iVar52 + (int)((unkuint10)Var38 >> 0x10);
            iVar53 = iVar53 + iVar54;
            lVar48 = lVar48 + 4;
          } while (lVar48 != 8);
          __base[uVar41 * 2] = iVar53 + iVar50 + iVar52 + iVar45;
          __base[uVar41 * 2 + 1] = (int)uVar41;
          uVar41 = uVar41 + 1;
          puVar43 = puVar43 + 1;
        } while (uVar41 != __nmemb);
        qsort(__base,__nmemb,8,iq2_compare_func);
        lVar48 = (long)(int)uVar66;
        __s[uVar40] = ~uVar66;
        iVar45 = *__base;
        iVar50 = uVar66 + 1;
        uVar66 = (uVar47 | 1) + uVar66;
        iVar52 = 1;
        uVar41 = 0;
        do {
          if (iVar45 < __base[uVar41 * 2]) {
            if (iVar52 == iVar49) {
              uVar66 = iVar50 + (int)uVar41;
              uVar46 = uVar41;
              break;
            }
            iVar52 = iVar52 + 1;
            iVar45 = __base[uVar41 * 2];
          }
          puVar51[(long)iVar50 + uVar41] = *(uint16_t *)(__base + uVar41 * 2 + 1);
          uVar41 = uVar41 + 1;
          uVar46 = __nmemb;
        } while (__nmemb != uVar41);
        puVar51[lVar48] = (uint16_t)uVar46;
      }
      uVar40 = uVar40 + 1;
    } while (uVar40 != 0xaaac);
    free(__base);
  }
  return;
}

Assistant:

void iq2xs_init_impl(enum ggml_type type) {
    const int gindex = iq2_data_index(type);
    const int grid_size = iq2_grid_size(type);
    if (iq2_data[gindex].grid) {
        return;
    }
    static const uint16_t kgrid_2bit_256[256] = {
            0,     2,     5,     8,    10,    17,    20,    32,    34,    40,    42,    65,    68,    80,    88,    97,
          100,   128,   130,   138,   162,   257,   260,   272,   277,   320,   388,   408,   512,   514,   546,   642,
         1025,  1028,  1040,  1057,  1060,  1088,  1090,  1096,  1120,  1153,  1156,  1168,  1188,  1280,  1282,  1288,
         1312,  1350,  1385,  1408,  1425,  1545,  1552,  1600,  1668,  1700,  2048,  2053,  2056,  2068,  2088,  2113,
         2116,  2128,  2130,  2184,  2308,  2368,  2562,  2580,  4097,  4100,  4112,  4129,  4160,  4192,  4228,  4240,
         4245,  4352,  4360,  4384,  4432,  4442,  4480,  4644,  4677,  5120,  5128,  5152,  5157,  5193,  5248,  5400,
         5474,  5632,  5654,  6145,  6148,  6160,  6208,  6273,  6400,  6405,  6560,  6737,  8192,  8194,  8202,  8260,
         8289,  8320,  8322,  8489,  8520,  8704,  8706,  9217,  9220,  9232,  9280,  9302,  9472,  9537,  9572,  9872,
        10248, 10272, 10388, 10820, 16385, 16388, 16400, 16408, 16417, 16420, 16448, 16456, 16470, 16480, 16513, 16516,
        16528, 16640, 16672, 16737, 16768, 16773, 16897, 16912, 16968, 16982, 17000, 17408, 17416, 17440, 17536, 17561,
        17682, 17700, 17920, 18433, 18436, 18448, 18496, 18501, 18688, 18776, 18785, 18818, 19013, 19088, 20480, 20488,
        20497, 20505, 20512, 20608, 20616, 20740, 20802, 20900, 21137, 21648, 21650, 21770, 22017, 22100, 22528, 22545,
        22553, 22628, 22848, 23048, 24580, 24592, 24640, 24680, 24832, 24917, 25112, 25184, 25600, 25605, 25872, 25874,
        25988, 26690, 32768, 32770, 32778, 32833, 32898, 33028, 33048, 33088, 33297, 33793, 33796, 33808, 33813, 33856,
        33888, 34048, 34118, 34196, 34313, 34368, 34400, 34818, 35076, 35345, 36868, 36880, 36900, 36928, 37025, 37142,
        37248, 37445, 37888, 37922, 37956, 38225, 39041, 39200, 40962, 41040, 41093, 41225, 41472, 42008, 43088, 43268,
    };
    static const uint16_t kgrid_2bit_512[512] = {
            0,     2,     5,     8,    10,    17,    20,    22,    25,    32,    34,    37,    40,    65,    68,    70,
           73,    80,    82,    85,    88,    97,   100,   128,   130,   133,   136,   145,   148,   153,   160,   257,
          260,   262,   265,   272,   274,   277,   280,   282,   289,   292,   320,   322,   325,   328,   337,   340,
          352,   360,   385,   388,   400,   512,   514,   517,   520,   529,   532,   544,   577,   580,   592,   597,
          640,   650,  1025,  1028,  1030,  1033,  1040,  1042,  1045,  1048,  1057,  1060,  1088,  1090,  1093,  1096,
         1105,  1108,  1110,  1120,  1153,  1156,  1168,  1280,  1282,  1285,  1288,  1297,  1300,  1312,  1345,  1348,
         1360,  1377,  1408,  1537,  1540,  1552,  1574,  1600,  1602,  1668,  2048,  2050,  2053,  2056,  2058,  2065,
         2068,  2080,  2085,  2113,  2116,  2128,  2136,  2176,  2208,  2218,  2305,  2308,  2320,  2368,  2433,  2441,
         2560,  2592,  2600,  2710,  2720,  4097,  4100,  4102,  4105,  4112,  4114,  4117,  4120,  4129,  4132,  4160,
         4162,  4165,  4168,  4177,  4180,  4192,  4202,  4225,  4228,  4240,  4352,  4354,  4357,  4360,  4369,  4372,
         4384,  4417,  4420,  4432,  4480,  4500,  4502,  4609,  4612,  4614,  4624,  4672,  4704,  5120,  5122,  5125,
         5128,  5137,  5140,  5152,  5185,  5188,  5193,  5200,  5220,  5248,  5377,  5380,  5392,  5440,  5632,  5652,
         5705,  6145,  6148,  6160,  6162,  6208,  6228,  6278,  6400,  6405,  6502,  6737,  6825,  8192,  8194,  8197,
         8200,  8202,  8209,  8212,  8224,  8257,  8260,  8272,  8320,  8352,  8449,  8452,  8464,  8512,  8520,  8549,
         8704,  8738,  8832,  8872,  9217,  9220,  9232,  9257,  9280,  9472,  9537,  9554,  9625,  9729,  9754,  9894,
        10240, 10248, 10250, 10272, 10325, 10376, 10402, 10600, 10640, 10760, 10784, 10882, 10888, 10890, 16385, 16388,
        16390, 16393, 16400, 16402, 16405, 16408, 16417, 16420, 16448, 16450, 16453, 16456, 16458, 16465, 16468, 16480,
        16485, 16513, 16516, 16528, 16640, 16642, 16645, 16648, 16657, 16660, 16672, 16705, 16708, 16720, 16768, 16773,
        16802, 16897, 16900, 16912, 16914, 16937, 16960, 17408, 17410, 17413, 17416, 17425, 17428, 17433, 17440, 17473,
        17476, 17488, 17536, 17556, 17665, 17668, 17680, 17700, 17728, 17818, 17920, 17930, 17988, 18000, 18433, 18436,
        18448, 18496, 18501, 18516, 18530, 18688, 18705, 18756, 18768, 18793, 18948, 20480, 20482, 20485, 20488, 20497,
        20500, 20512, 20520, 20545, 20548, 20560, 20608, 20737, 20740, 20752, 20757, 20800, 20802, 20992, 21060, 21162,
        21505, 21508, 21520, 21537, 21568, 21600, 21633, 21665, 21760, 21768, 21888, 21896, 22049, 22120, 22177, 22528,
        22548, 22593, 22608, 22681, 22810, 22848, 22850, 23173, 24577, 24580, 24592, 24640, 24660, 24674, 24710, 24745,
        24832, 25124, 25162, 25234, 25600, 25622, 25872, 25920, 25925, 26020, 26625, 26730, 26917, 27142, 27220, 27234,
        32768, 32770, 32773, 32776, 32785, 32788, 32800, 32810, 32833, 32836, 32848, 32896, 32898, 32936, 32938, 33025,
        33028, 33030, 33040, 33088, 33105, 33113, 33280, 33312, 33408, 33410, 33440, 33448, 33793, 33796, 33808, 33810,
        33813, 33856, 33888, 33929, 34048, 34116, 34213, 34328, 34410, 34816, 34824, 34853, 34906, 34944, 34946, 34984,
        35078, 35362, 35456, 35464, 35478, 35496, 36865, 36868, 36880, 36928, 36950, 36996, 37120, 37154, 37220, 37462,
        37513, 37888, 37893, 37956, 37968, 37976, 38185, 38288, 38290, 38465, 38993, 39078, 39241, 39445, 39520, 40960,
        40962, 40968, 40970, 40992, 41002, 41120, 41297, 41305, 41382, 41472, 41474, 41480, 41514, 41600, 41632, 42048,
        42133, 42597, 42648, 43018, 43040, 43042, 43048, 43168, 43176, 43268, 43396, 43398, 43560, 43562, 43665, 43690,
    };
    static const uint16_t kgrid_1bit_2048[NGRID_IQ1S] = {
            0,     2,     5,     8,    10,    17,    21,    32,    34,    40,    42,    69,    81,    84,    86,   101,
          128,   130,   136,   138,   149,   160,   162,   168,   170,   260,   261,   273,   276,   278,   281,   282,
          293,   321,   326,   329,   338,   341,   346,   353,   356,   358,   360,   389,   401,   404,   406,   421,
          512,   514,   520,   522,   533,   544,   546,   552,   554,   581,   593,   601,   612,   617,   640,   642,
          648,   650,   657,   661,   665,   672,   674,   680,   682,  1041,  1044,  1046,  1061,  1089,  1097,  1109,
         1114,  1124,  1125,  1169,  1177,  1189,  1281,  1284,  1285,  1286,  1301,  1304,  1306,  1321,  1344,  1349,
         1354,  1360,  1361,  1364,  1365,  1366,  1369,  1376,  1378,  1381,  1384,  1386,  1409,  1425,  1429,  1432,
         1434,  1441,  1444,  1445,  1446,  1449,  1556,  1561,  1601,  1604,  1616,  1618,  1621,  1624,  1632,  1633,
         1638,  1641,  1669,  1681,  1684,  1689,  2048,  2050,  2056,  2058,  2069,  2080,  2082,  2088,  2090,  2117,
         2129,  2134,  2149,  2176,  2178,  2184,  2186,  2197,  2208,  2210,  2216,  2218,  2309,  2321,  2324,  2329,
         2340,  2341,  2369,  2384,  2385,  2389,  2401,  2404,  2409,  2449,  2452,  2454,  2457,  2469,  2560,  2562,
         2568,  2570,  2581,  2592,  2594,  2600,  2602,  2629,  2641,  2649,  2657,  2661,  2688,  2690,  2693,  2696,
         2698,  2709,  2720,  2722,  2728,  2730,  4112,  4113,  4116,  4121,  4132,  4133,  4161,  4164,  4176,  4181,
         4184,  4193,  4196,  4197,  4201,  4241,  4244,  4246,  4257,  4261,  4353,  4356,  4358,  4361,  4368,  4370,
         4373,  4376,  4385,  4388,  4393,  4421,  4426,  4432,  4433,  4434,  4436,  4437,  4438,  4441,  4448,  4453,
         4484,  4498,  4501,  4513,  4516,  4625,  4628,  4630,  4645,  4672,  4678,  4681,  4690,  4693,  4696,  4698,
         4708,  4710,  4741,  4753,  4756,  4758,  4773,  5121,  5126,  5129,  5140,  5141,  5144,  5145,  5153,  5158,
         5185,  5189,  5190,  5192,  5194,  5201,  5204,  5205,  5206,  5209,  5218,  5221,  5224,  5252,  5257,  5264,
         5268,  5269,  5272,  5273,  5274,  5281,  5284,  5285,  5289,  5378,  5381,  5386,  5393,  5396,  5397,  5398,
         5401,  5408,  5410,  5413,  5416,  5418,  5441,  5444,  5445,  5446,  5457,  5458,  5460,  5461,  5462,  5465,
         5466,  5473,  5476,  5477,  5478,  5481,  5504,  5506,  5508,  5509,  5512,  5514,  5520,  5521,  5524,  5525,
         5526,  5529,  5530,  5536,  5538,  5541,  5633,  5636,  5637,  5638,  5653,  5654,  5656,  5658,  5665,  5670,
         5696,  5698,  5700,  5701,  5704,  5706,  5713,  5717,  5718,  5720,  5721,  5729,  5732,  5733,  5736,  5737,
         5738,  5766,  5770,  5778,  5781,  5796,  5801,  6161,  6166,  6181,  6209,  6212,  6214,  6217,  6224,  6229,
         6232,  6234,  6240,  6241,  6244,  6246,  6249,  6277,  6289,  6292,  6309,  6416,  6418,  6421,  6426,  6433,
         6437,  6466,  6468,  6469,  6472,  6481,  6484,  6485,  6486,  6489,  6490,  6496,  6501,  6506,  6537,  6545,
         6546,  6549,  6552,  6561,  6566,  6569,  6665,  6678,  6692,  6694,  6724,  6726,  6729,  6736,  6738,  6741,
         6744,  6753,  6758,  6761,  6789,  6801,  6806,  6810,  8192,  8194,  8200,  8202,  8213,  8224,  8226,  8229,
         8232,  8234,  8261,  8273,  8281,  8289,  8293,  8320,  8322,  8328,  8330,  8341,  8352,  8354,  8357,  8360,
         8362,  8453,  8465,  8468,  8473,  8485,  8514,  8516,  8521,  8533,  8536,  8538,  8545,  8548,  8549,  8550,
         8581,  8592,  8598,  8601,  8613,  8705,  8712,  8714,  8721,  8725,  8736,  8738,  8744,  8746,  8773,  8785,
         8790,  8793,  8805,  8833,  8840,  8842,  8849,  8853,  8864,  8866,  8872,  8874,  9221,  9236,  9238,  9241,
         9253,  9284,  9285,  9286,  9289,  9298,  9301,  9304,  9306,  9318,  9349,  9361,  9364,  9369,  9377,  9381,
         9481,  9493,  9505,  9513,  9536,  9541,  9544,  9553,  9556,  9557,  9561,  9570,  9573,  9576,  9609,  9616,
         9620,  9621,  9624,  9626,  9633,  9636,  9638,  9641,  9733,  9744,  9746,  9753,  9765,  9793,  9801,  9813,
         9824,  9825,  9833,  9860,  9862,  9872,  9882, 10240, 10242, 10248, 10250, 10261, 10272, 10274, 10280, 10282,
        10309, 10321, 10324, 10341, 10368, 10370, 10376, 10378, 10400, 10402, 10408, 10410, 10505, 10513, 10516, 10521,
        10533, 10566, 10569, 10578, 10581, 10593, 10596, 10598, 10601, 10629, 10640, 10646, 10649, 10660, 10661, 10752,
        10754, 10760, 10762, 10784, 10786, 10792, 10794, 10821, 10833, 10838, 10841, 10853, 10880, 10882, 10888, 10890,
        10901, 10912, 10914, 10920, 10922, 16389, 16401, 16406, 16421, 16457, 16466, 16469, 16472, 16474, 16481, 16484,
        16486, 16532, 16537, 16545, 16550, 16640, 16641, 16644, 16646, 16649, 16658, 16661, 16662, 16664, 16666, 16673,
        16678, 16681, 16709, 16712, 16714, 16721, 16724, 16725, 16726, 16729, 16730, 16741, 16744, 16746, 16769, 16772,
        16774, 16784, 16786, 16789, 16800, 16801, 16802, 16901, 16913, 16916, 16918, 16933, 16961, 16978, 16981, 16986,
        16996, 17001, 17033, 17044, 17061, 17409, 17429, 17433, 17449, 17477, 17480, 17482, 17489, 17492, 17493, 17494,
        17505, 17506, 17509, 17512, 17514, 17537, 17542, 17545, 17552, 17554, 17557, 17568, 17569, 17577, 17665, 17666,
        17669, 17674, 17681, 17684, 17685, 17686, 17689, 17696, 17701, 17706, 17729, 17732, 17733, 17734, 17737, 17744,
        17745, 17748, 17749, 17750, 17752, 17753, 17761, 17764, 17765, 17766, 17769, 17794, 17796, 17797, 17800, 17809,
        17812, 17813, 17814, 17817, 17818, 17829, 17832, 17834, 17921, 17925, 17929, 17940, 17941, 17944, 17946, 17953,
        17956, 17961, 17984, 17986, 17989, 17992, 18000, 18001, 18002, 18005, 18006, 18009, 18018, 18021, 18024, 18049,
        18053, 18058, 18068, 18069, 18081, 18084, 18086, 18437, 18449, 18453, 18458, 18469, 18498, 18505, 18512, 18517,
        18520, 18529, 18532, 18534, 18537, 18565, 18577, 18580, 18582, 18585, 18597, 18689, 18693, 18694, 18698, 18704,
        18708, 18709, 18712, 18721, 18724, 18726, 18752, 18757, 18762, 18769, 18770, 18772, 18773, 18774, 18777, 18784,
        18786, 18789, 18790, 18794, 18822, 18825, 18834, 18837, 18838, 18840, 18849, 18852, 18854, 18857, 18966, 19012,
        19014, 19017, 19029, 19032, 19034, 19044, 19049, 19092, 19109, 20481, 20484, 20485, 20486, 20489, 20498, 20501,
        20506, 20513, 20516, 20521, 20544, 20549, 20552, 20561, 20564, 20565, 20566, 20569, 20581, 20584, 20614, 20617,
        20629, 20632, 20640, 20641, 20646, 20649, 20741, 20744, 20745, 20746, 20753, 20756, 20757, 20758, 20760, 20761,
        20768, 20773, 20774, 20776, 20778, 20801, 20804, 20805, 20806, 20809, 20816, 20817, 20818, 20820, 20821, 20822,
        20824, 20825, 20826, 20833, 20836, 20837, 20838, 20841, 20866, 20869, 20881, 20884, 20885, 20886, 20889, 20896,
        20901, 20906, 20993, 20998, 21010, 21013, 21018, 21025, 21028, 21058, 21061, 21066, 21073, 21076, 21077, 21078,
        21081, 21090, 21093, 21125, 21136, 21138, 21141, 21145, 21146, 21156, 21508, 21509, 21521, 21524, 21525, 21526,
        21528, 21529, 21537, 21541, 21544, 21546, 21569, 21572, 21573, 21574, 21577, 21578, 21584, 21585, 21588, 21589,
        21590, 21592, 21593, 21594, 21601, 21602, 21604, 21605, 21606, 21609, 21632, 21640, 21642, 21649, 21652, 21653,
        21654, 21657, 21665, 21668, 21669, 21674, 21761, 21762, 21764, 21765, 21766, 21769, 21776, 21777, 21778, 21780,
        21781, 21782, 21785, 21786, 21793, 21796, 21797, 21798, 21801, 21824, 21825, 21826, 21828, 21829, 21830, 21832,
        21833, 21840, 21841, 21842, 21844, 21845, 21846, 21848, 21849, 21850, 21856, 21857, 21860, 21861, 21862, 21864,
        21865, 21866, 21889, 21892, 21893, 21897, 21898, 21904, 21905, 21908, 21909, 21910, 21912, 21913, 21921, 21924,
        21925, 21926, 21929, 22016, 22017, 22018, 22020, 22022, 22024, 22025, 22033, 22036, 22037, 22040, 22041, 22048,
        22049, 22050, 22052, 22053, 22054, 22056, 22057, 22081, 22085, 22086, 22088, 22089, 22090, 22096, 22097, 22098,
        22100, 22101, 22102, 22104, 22105, 22106, 22113, 22116, 22117, 22121, 22146, 22149, 22150, 22152, 22153, 22154,
        22161, 22165, 22170, 22178, 22181, 22182, 22184, 22185, 22532, 22533, 22534, 22537, 22544, 22549, 22552, 22561,
        22570, 22597, 22600, 22602, 22609, 22612, 22613, 22614, 22616, 22617, 22624, 22626, 22628, 22629, 22658, 22665,
        22672, 22674, 22677, 22680, 22689, 22697, 22785, 22786, 22789, 22794, 22801, 22804, 22805, 22806, 22809, 22821,
        22849, 22852, 22853, 22854, 22857, 22864, 22865, 22866, 22868, 22869, 22870, 22872, 22873, 22874, 22881, 22884,
        22885, 22886, 22889, 22913, 22917, 22921, 22929, 22932, 22933, 22934, 22936, 22937, 22949, 23044, 23048, 23061,
        23066, 23072, 23077, 23078, 23081, 23109, 23112, 23113, 23121, 23125, 23126, 23128, 23129, 23138, 23141, 23144,
        23146, 23169, 23178, 23186, 23189, 23190, 23192, 23194, 23201, 24581, 24596, 24598, 24601, 24613, 24644, 24656,
        24661, 24662, 24664, 24666, 24673, 24676, 24678, 24681, 24705, 24726, 24741, 24833, 24836, 24838, 24841, 24850,
        24853, 24865, 24866, 24870, 24873, 24901, 24905, 24913, 24917, 24918, 24921, 24933, 24934, 24938, 24964, 24970,
        24978, 24981, 24993, 24998, 25001, 25105, 25110, 25113, 25152, 25153, 25158, 25173, 25174, 25176, 25184, 25221,
        25233, 25238, 25253, 25617, 25618, 25621, 25622, 25626, 25633, 25638, 25641, 25664, 25666, 25669, 25672, 25674,
        25681, 25684, 25685, 25686, 25689, 25690, 25696, 25698, 25701, 25732, 25733, 25737, 25744, 25746, 25748, 25749,
        25750, 25752, 25754, 25761, 25764, 25769, 25861, 25864, 25866, 25873, 25877, 25878, 25881, 25924, 25925, 25926,
        25929, 25936, 25937, 25940, 25941, 25942, 25945, 25953, 25956, 25957, 25958, 25961, 25990, 25993, 25994, 26001,
        26005, 26006, 26009, 26010, 26018, 26021, 26022, 26024, 26114, 26121, 26133, 26144, 26150, 26152, 26153, 26176,
        26181, 26184, 26186, 26193, 26196, 26197, 26198, 26200, 26202, 26208, 26213, 26216, 26240, 26242, 26245, 26250,
        26260, 26262, 26264, 26265, 26272, 26276, 26278, 26282, 26646, 26649, 26661, 26689, 26706, 26709, 26714, 26721,
        26729, 26757, 26769, 26776, 26790, 26881, 26884, 26896, 26901, 26913, 26916, 26918, 26921, 26944, 26945, 26949,
        26950, 26952, 26961, 26964, 26965, 26966, 26969, 26976, 26981, 26986, 27010, 27012, 27018, 27029, 27041, 27044,
        27045, 27049, 27153, 27158, 27160, 27201, 27204, 27209, 27216, 27221, 27224, 27226, 27236, 27237, 27241, 27270,
        27284, 27288, 27290, 27302, 32768, 32770, 32776, 32778, 32800, 32802, 32808, 32810, 32837, 32848, 32849, 32852,
        32854, 32857, 32869, 32896, 32898, 32904, 32906, 32917, 32928, 32930, 32936, 32938, 33029, 33041, 33044, 33046,
        33049, 33061, 33089, 33092, 33097, 33104, 33106, 33109, 33110, 33112, 33113, 33124, 33126, 33129, 33157, 33161,
        33172, 33174, 33177, 33189, 33280, 33282, 33288, 33290, 33301, 33312, 33314, 33320, 33322, 33361, 33364, 33369,
        33381, 33408, 33410, 33416, 33418, 33429, 33440, 33442, 33448, 33450, 33812, 33817, 33857, 33860, 33873, 33877,
        33882, 33889, 33892, 33897, 33940, 33945, 34049, 34057, 34066, 34069, 34074, 34086, 34089, 34112, 34113, 34117,
        34120, 34129, 34132, 34133, 34134, 34137, 34138, 34149, 34150, 34152, 34154, 34177, 34180, 34182, 34185, 34192,
        34194, 34197, 34200, 34214, 34321, 34326, 34329, 34341, 34369, 34372, 34377, 34378, 34384, 34389, 34393, 34394,
        34401, 34406, 34410, 34437, 34449, 34458, 34468, 34816, 34818, 34824, 34826, 34837, 34848, 34850, 34856, 34858,
        34881, 34885, 34897, 34900, 34905, 34917, 34921, 34944, 34946, 34952, 34954, 34965, 34976, 34978, 34984, 34986,
        35077, 35078, 35089, 35092, 35094, 35109, 35137, 35140, 35142, 35145, 35152, 35154, 35157, 35162, 35169, 35172,
        35205, 35222, 35225, 35237, 35328, 35330, 35336, 35338, 35349, 35360, 35362, 35368, 35370, 35397, 35409, 35412,
        35414, 35456, 35458, 35464, 35466, 35477, 35488, 35490, 35496, 35498, 36869, 36881, 36886, 36888, 36889, 36901,
        36929, 36934, 36937, 36949, 36952, 36954, 36969, 36970, 36997, 37009, 37012, 37014, 37017, 37029, 37121, 37124,
        37126, 37129, 37136, 37141, 37144, 37146, 37153, 37156, 37158, 37161, 37184, 37189, 37200, 37201, 37204, 37205,
        37206, 37209, 37218, 37221, 37252, 37254, 37266, 37269, 37272, 37281, 37284, 37286, 37289, 37381, 37393, 37396,
        37401, 37413, 37444, 37446, 37449, 37456, 37458, 37461, 37464, 37478, 37481, 37509, 37524, 37526, 37545, 37889,
        37892, 37894, 37904, 37909, 37912, 37926, 37952, 37962, 37969, 37972, 37973, 37974, 37976, 37977, 37984, 37985,
        37986, 37989, 38020, 38022, 38034, 38036, 38037, 38040, 38049, 38057, 38144, 38149, 38152, 38154, 38160, 38161,
        38164, 38165, 38166, 38169, 38177, 38181, 38185, 38186, 38209, 38212, 38213, 38214, 38217, 38224, 38225, 38226,
        38228, 38229, 38230, 38232, 38233, 38234, 38241, 38244, 38245, 38246, 38249, 38273, 38277, 38280, 38289, 38290,
        38292, 38293, 38294, 38297, 38298, 38304, 38306, 38309, 38312, 38314, 38401, 38404, 38416, 38421, 38425, 38432,
        38438, 38441, 38469, 38472, 38473, 38481, 38482, 38485, 38486, 38489, 38501, 38504, 38530, 38532, 38537, 38538,
        38546, 38548, 38549, 38564, 38566, 38569, 38917, 38934, 38937, 38949, 38977, 38982, 38992, 38994, 38997, 38998,
        39002, 39012, 39013, 39045, 39057, 39062, 39065, 39077, 39172, 39174, 39177, 39184, 39186, 39189, 39192, 39194,
        39200, 39201, 39204, 39206, 39232, 39234, 39237, 39240, 39242, 39249, 39252, 39253, 39254, 39257, 39266, 39269,
        39270, 39274, 39297, 39300, 39312, 39314, 39317, 39322, 39329, 39334, 39429, 39445, 39461, 39492, 39494, 39497,
        39504, 39509, 39512, 39521, 39557, 39569, 39572, 39573, 39574, 40960, 40962, 40968, 40970, 40981, 40992, 40994,
        41000, 41002, 41029, 41041, 41044, 41046, 41049, 41088, 41090, 41096, 41098, 41109, 41120, 41122, 41128, 41130,
        41221, 41225, 41233, 41236, 41238, 41241, 41242, 41286, 41289, 41297, 41301, 41304, 41306, 41313, 41316, 41349,
        41360, 41362, 41366, 41369, 41474, 41480, 41482, 41488, 41497, 41506, 41512, 41514, 41541, 41553, 41558, 41561,
        41573, 41600, 41602, 41608, 41610, 41621, 41632, 41634, 41640, 41642, 42009, 42021, 42049, 42052, 42064, 42068,
        42069, 42072, 42074, 42081, 42085, 42086, 42088, 42089, 42117, 42246, 42249, 42256, 42258, 42261, 42264, 42278,
        42281, 42306, 42309, 42321, 42324, 42325, 42326, 42329, 42341, 42346, 42369, 42372, 42373, 42374, 42377, 42386,
        42389, 42392, 42501, 42513, 42518, 42522, 42529, 42533, 42564, 42566, 42570, 42578, 42581, 42582, 42584, 42592,
        42594, 42630, 42640, 42645, 42646, 42649, 42657, 42660, 42662, 43008, 43010, 43016, 43018, 43040, 43042, 43048,
        43050, 43089, 43092, 43094, 43097, 43136, 43138, 43144, 43146, 43157, 43168, 43170, 43176, 43178, 43269, 43284,
        43289, 43297, 43301, 43329, 43344, 43349, 43354, 43361, 43366, 43369, 43408, 43414, 43520, 43522, 43528, 43530,
        43552, 43554, 43560, 43562, 43601, 43604, 43606, 43648, 43650, 43656, 43658, 43669, 43680, 43682, 43688, 43690,
    };
    static const uint16_t kgrid_2bit_1024[1024] = {
            0,     2,     5,     8,    10,    17,    20,    22,    25,    32,    34,    37,    40,    65,    68,    70,
           73,    80,    82,    85,    88,    97,   100,   102,   105,   128,   130,   133,   136,   145,   148,   160,
          165,   170,   257,   260,   262,   265,   272,   274,   277,   280,   289,   292,   320,   322,   325,   328,
          337,   340,   342,   345,   352,   357,   360,   385,   388,   400,   402,   405,   417,   420,   512,   514,
          517,   520,   529,   532,   544,   554,   577,   580,   582,   585,   592,   597,   640,   645,   650,   660,
          674,  1025,  1028,  1030,  1033,  1040,  1042,  1045,  1048,  1057,  1060,  1062,  1065,  1088,  1090,  1093,
         1096,  1098,  1105,  1108,  1110,  1113,  1120,  1122,  1125,  1153,  1156,  1158,  1161,  1168,  1173,  1176,
         1185,  1188,  1280,  1282,  1285,  1288,  1290,  1297,  1300,  1302,  1305,  1312,  1317,  1320,  1345,  1348,
         1350,  1353,  1360,  1362,  1365,  1368,  1377,  1380,  1408,  1410,  1413,  1416,  1425,  1428,  1440,  1537,
         1540,  1542,  1545,  1552,  1557,  1600,  1605,  1608,  1617,  1620,  1632,  1665,  1668,  1680,  2048,  2050,
         2053,  2056,  2065,  2068,  2070,  2073,  2080,  2085,  2090,  2113,  2116,  2118,  2121,  2128,  2130,  2133,
         2136,  2145,  2148,  2176,  2181,  2196,  2218,  2305,  2308,  2320,  2322,  2325,  2328,  2337,  2368,  2373,
         2376,  2385,  2388,  2400,  2433,  2448,  2560,  2577,  2580,  2594,  2600,  2602,  2640,  2713,  4097,  4100,
         4102,  4105,  4112,  4114,  4117,  4120,  4129,  4132,  4134,  4160,  4162,  4165,  4168,  4177,  4180,  4182,
         4185,  4192,  4194,  4197,  4200,  4225,  4228,  4230,  4240,  4245,  4248,  4257,  4260,  4352,  4354,  4357,
         4360,  4362,  4369,  4372,  4374,  4377,  4384,  4386,  4389,  4392,  4417,  4420,  4422,  4425,  4432,  4434,
         4437,  4440,  4449,  4452,  4480,  4482,  4485,  4488,  4497,  4500,  4609,  4612,  4617,  4624,  4629,  4641,
         4644,  4672,  4677,  4689,  4692,  4737,  4740,  4752,  5120,  5122,  5125,  5128,  5137,  5140,  5142,  5145,
         5152,  5157,  5160,  5185,  5188,  5190,  5193,  5200,  5202,  5205,  5208,  5217,  5220,  5248,  5250,  5253,
         5256,  5265,  5268,  5280,  5377,  5380,  5382,  5385,  5392,  5394,  5397,  5400,  5409,  5412,  5440,  5442,
         5445,  5448,  5457,  5460,  5472,  5505,  5508,  5520,  5632,  5637,  5640,  5649,  5652,  5664,  5697,  5700,
         5712,  5760,  5802,  6145,  6148,  6150,  6153,  6160,  6165,  6168,  6177,  6208,  6210,  6213,  6216,  6225,
         6228,  6240,  6273,  6276,  6400,  6402,  6405,  6408,  6417,  6420,  6432,  6465,  6468,  6480,  6505,  6562,
         6660,  6672,  6720,  6742,  8192,  8194,  8197,  8200,  8209,  8212,  8214,  8217,  8224,  8229,  8234,  8257,
         8260,  8272,  8274,  8277,  8292,  8320,  8330,  8340,  8362,  8449,  8452,  8464,  8466,  8469,  8481,  8512,
         8514,  8517,  8529,  8532,  8544,  8577,  8580,  8592,  8704,  8714,  8738,  8744,  8746,  8772,  8784,  8840,
         8842,  8872,  9217,  9220,  9222,  9225,  9232,  9237,  9240,  9249,  9252,  9280,  9282,  9285,  9288,  9297,
         9300,  9312,  9345,  9348,  9360,  9472,  9477,  9480,  9489,  9492,  9504,  9537,  9540,  9552,  9574,  9600,
         9729,  9732,  9744,  9792,  9817, 10240, 10245, 10257, 10260, 10305, 10308, 10320, 10378, 10410, 10497, 10500,
        10512, 10645, 10762, 10786, 10852, 10888, 10890, 16385, 16388, 16390, 16393, 16400, 16402, 16405, 16408, 16410,
        16417, 16420, 16422, 16448, 16450, 16453, 16456, 16458, 16465, 16468, 16470, 16473, 16480, 16482, 16485, 16513,
        16516, 16528, 16533, 16536, 16545, 16548, 16640, 16642, 16645, 16648, 16657, 16660, 16662, 16665, 16672, 16674,
        16677, 16705, 16708, 16710, 16713, 16720, 16722, 16725, 16728, 16737, 16740, 16768, 16770, 16773, 16776, 16785,
        16788, 16800, 16897, 16900, 16912, 16914, 16917, 16920, 16932, 16960, 16965, 16968, 16977, 16980, 16992, 17025,
        17028, 17408, 17410, 17413, 17416, 17418, 17425, 17428, 17430, 17433, 17440, 17442, 17445, 17448, 17473, 17476,
        17478, 17481, 17488, 17490, 17493, 17496, 17505, 17508, 17536, 17538, 17541, 17544, 17553, 17556, 17568, 17665,
        17668, 17670, 17673, 17680, 17682, 17685, 17688, 17697, 17700, 17728, 17730, 17733, 17736, 17745, 17748, 17760,
        17770, 17793, 17796, 17808, 17920, 17922, 17925, 17928, 17937, 17940, 17952, 17985, 17988, 18000, 18048, 18085,
        18433, 18436, 18441, 18448, 18450, 18453, 18456, 18465, 18468, 18496, 18498, 18501, 18504, 18513, 18516, 18528,
        18564, 18576, 18688, 18690, 18693, 18696, 18705, 18708, 18720, 18753, 18756, 18768, 18816, 18838, 18945, 18948,
        18960, 19008, 20480, 20482, 20485, 20488, 20497, 20500, 20502, 20505, 20512, 20514, 20517, 20520, 20545, 20548,
        20550, 20553, 20560, 20562, 20565, 20568, 20577, 20580, 20608, 20610, 20613, 20616, 20625, 20628, 20737, 20740,
        20742, 20745, 20752, 20754, 20757, 20760, 20769, 20772, 20800, 20802, 20805, 20808, 20817, 20820, 20832, 20865,
        20868, 20880, 20992, 20997, 21000, 21009, 21012, 21024, 21057, 21060, 21072, 21097, 21120, 21505, 21508, 21510,
        21513, 21520, 21522, 21525, 21528, 21537, 21540, 21568, 21570, 21573, 21576, 21585, 21588, 21600, 21633, 21636,
        21648, 21760, 21762, 21765, 21768, 21777, 21780, 21792, 21825, 21828, 21840, 21888, 22017, 22020, 22032, 22054,
        22080, 22528, 22530, 22533, 22536, 22545, 22548, 22560, 22593, 22596, 22608, 22618, 22656, 22785, 22788, 22800,
        22848, 23040, 23065, 23173, 23208, 24577, 24580, 24582, 24592, 24594, 24597, 24600, 24609, 24612, 24640, 24645,
        24648, 24657, 24660, 24672, 24708, 24720, 24832, 24834, 24837, 24840, 24849, 24852, 24864, 24897, 24900, 24912,
        24960, 24985, 25092, 25104, 25152, 25174, 25249, 25600, 25605, 25608, 25617, 25620, 25632, 25665, 25668, 25680,
        25728, 25857, 25860, 25872, 25920, 25930, 25960, 26002, 26112, 26260, 26625, 26628, 26640, 26725, 26776, 26880,
        26922, 27202, 27297, 32768, 32770, 32773, 32776, 32785, 32788, 32793, 32800, 32805, 32833, 32836, 32848, 32850,
        32853, 32856, 32865, 32896, 32901, 32913, 32916, 33025, 33028, 33033, 33040, 33042, 33045, 33048, 33057, 33060,
        33088, 33090, 33093, 33096, 33105, 33108, 33153, 33156, 33168, 33193, 33280, 33285, 33290, 33297, 33300, 33345,
        33348, 33360, 33793, 33796, 33798, 33801, 33808, 33810, 33813, 33816, 33825, 33856, 33858, 33861, 33864, 33873,
        33876, 33888, 33921, 33924, 33936, 34048, 34050, 34053, 34056, 34065, 34068, 34080, 34113, 34116, 34128, 34176,
        34186, 34305, 34308, 34320, 34345, 34368, 34816, 34821, 34833, 34836, 34881, 34884, 34896, 34978, 35073, 35076,
        35136, 35173, 35362, 35416, 35418, 35458, 35490, 36865, 36868, 36873, 36880, 36882, 36885, 36888, 36900, 36928,
        36930, 36933, 36936, 36945, 36948, 36960, 36993, 36996, 37008, 37120, 37125, 37137, 37140, 37185, 37188, 37200,
        37210, 37377, 37380, 37392, 37440, 37542, 37888, 37890, 37893, 37896, 37905, 37908, 37920, 37953, 37956, 37968,
        38016, 38038, 38145, 38148, 38160, 38208, 38296, 38305, 38400, 38470, 38500, 38913, 38916, 38928, 38950, 38976,
        39081, 39168, 39241, 39250, 39568, 40960, 40965, 40970, 40980, 40994, 41002, 41025, 41028, 41040, 41122, 41130,
        41280, 41317, 41474, 41482, 41506, 41512, 41514, 41602, 41608, 41610, 41640, 41985, 41988, 42000, 42048, 42121,
        42148, 42240, 42265, 42577, 43018, 43048, 43170, 43348, 43398, 43528, 43530, 43552, 43554, 43560, 43656, 43690,
    };

    const int kmap_size = 43692;
    //const int nwant = type == GGML_TYPE_IQ1_S ? 3 : 2;
    const int nwant = type == GGML_TYPE_IQ1_S || type == GGML_TYPE_IQ1_M ? 3 : type == GGML_TYPE_IQ2_S ? 1 : 2;
    const uint16_t * kgrid = type == GGML_TYPE_IQ2_XXS ? kgrid_2bit_256 :
                             type == GGML_TYPE_IQ2_XS  ? kgrid_2bit_512 :
                             type == GGML_TYPE_IQ1_S || type == GGML_TYPE_IQ1_M ? kgrid_1bit_2048 : kgrid_2bit_1024;
    uint64_t * kgrid_q2xs;
    int      * kmap_q2xs;
    uint16_t * kneighbors_q2xs;

    //printf("================================================================= %s(grid_size = %d)\n", __func__, grid_size);
    uint64_t * the_grid = (uint64_t *)malloc(grid_size*sizeof(uint64_t));
    for (int k = 0; k < grid_size; ++k) {
        int8_t * pos = (int8_t *)(the_grid + k);
        for (int i = 0; i < 8; ++i) {
            int l = (kgrid[k] >> 2*i) & 0x3;
            pos[i] = 2*l + 1;
        }
    }
    kgrid_q2xs = the_grid;
    iq2_data[gindex].grid = the_grid;
    kmap_q2xs = (int *)malloc(kmap_size*sizeof(int));
    iq2_data[gindex].map = kmap_q2xs;
    for (int i = 0; i < kmap_size; ++i) kmap_q2xs[i] = -1;
    uint64_t aux64;
    uint8_t * aux8 = (uint8_t *)&aux64;
    for (int i = 0; i < grid_size; ++i) {
        aux64 = kgrid_q2xs[i];
        uint16_t index = 0;
        for (int k=0; k<8; ++k) {
            uint16_t q = (aux8[k] - 1)/2;
            index |= (q << 2*k);
        }
        kmap_q2xs[index] = i;
    }
    int8_t pos[8];
    int * dist2 = (int *)malloc(2*grid_size*sizeof(int));
    int num_neighbors = 0, num_not_in_map = 0;
    for (int i = 0; i < kmap_size; ++i) {
        if (kmap_q2xs[i] >= 0) continue;
        ++num_not_in_map;
        for (int k = 0; k < 8; ++k) {
            int l = (i >> 2*k) & 0x3;
            pos[k] = 2*l + 1;
        }
        for (int j = 0; j < grid_size; ++j) {
            const int8_t * pg = (const int8_t *)(kgrid_q2xs + j);
            int d2 = 0;
            for (int k = 0; k < 8; ++k) d2 += (pg[k] - pos[k])*(pg[k] - pos[k]);
            dist2[2*j+0] = d2;
            dist2[2*j+1] = j;
        }
        qsort(dist2, grid_size, 2*sizeof(int), iq2_compare_func);
        int n = 0; int d2 = dist2[0];
        int nhave = 1;
        for (int j = 0; j < grid_size; ++j) {
            if (dist2[2*j] > d2) {
                if (nhave == nwant) break;
                d2 = dist2[2*j];
                ++nhave;
            }
            ++n;
        }
        num_neighbors += n;
    }
    //printf("%s: %d neighbours in total\n", __func__, num_neighbors);
    kneighbors_q2xs = (uint16_t *)malloc((num_neighbors + num_not_in_map)*sizeof(uint16_t));
    iq2_data[gindex].neighbours = kneighbors_q2xs;
    int counter = 0;
    for (int i = 0; i < kmap_size; ++i) {
        if (kmap_q2xs[i] >= 0) continue;
        for (int k = 0; k < 8; ++k) {
            int l = (i >> 2*k) & 0x3;
            pos[k] = 2*l + 1;
        }
        for (int j = 0; j < grid_size; ++j) {
            const int8_t * pg = (const int8_t *)(kgrid_q2xs + j);
            int d2 = 0;
            for (int k = 0; k < 8; ++k) d2 += (pg[k] - pos[k])*(pg[k] - pos[k]);
            dist2[2*j+0] = d2;
            dist2[2*j+1] = j;
        }
        qsort(dist2, grid_size, 2*sizeof(int), iq2_compare_func);
        kmap_q2xs[i] = -(counter + 1);
        int d2 = dist2[0];
        uint16_t * start = &kneighbors_q2xs[counter++];
        int n = 0, nhave = 1;
        for (int j = 0; j < grid_size; ++j) {
            if (dist2[2*j] > d2) {
                if (nhave == nwant) break;
                d2 = dist2[2*j];
                ++nhave;
            }
            kneighbors_q2xs[counter++] = dist2[2*j+1];
            ++n;
        }
        *start = n;
    }
    free(dist2);
}